

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool GetParsePickListValue(TidyDocImpl *doc,TidyOptionImpl *entry,uint *result)

{
  PickListItems *paPVar1;
  ctmbstr s2;
  tchar c;
  Bool BVar2;
  int iVar3;
  uint i;
  uint uVar4;
  ulong uVar5;
  tmbchar work [16];
  
  c = SkipWhite(&doc->config);
  work[0] = '\0';
  work[1] = '\0';
  work[2] = '\0';
  work[3] = '\0';
  work[4] = '\0';
  work[5] = '\0';
  work[6] = '\0';
  work[7] = '\0';
  work[8] = '\0';
  work[9] = '\0';
  work[10] = '\0';
  work[0xb] = '\0';
  work[0xc] = '\0';
  work[0xd] = '\0';
  work[0xe] = '\0';
  work[0xf] = '\0';
  uVar5 = 0;
  while ((((c != 0xffffffff && (uVar5 < 0x10)) && (BVar2 = prvTidyIsWhite(c), BVar2 == no)) &&
         ((c != 10 && (c != 0xd))))) {
    work[uVar5] = (tmbchar)c;
    uVar5 = uVar5 + 1;
    c = AdvanceChar(&doc->config);
  }
  paPVar1 = entry->pickList;
  if (paPVar1 != (PickListItems *)0x0) {
    uVar4 = 0;
    while ((*paPVar1)[uVar4].label != (ctmbstr)0x0) {
      uVar5 = 0;
      while( true ) {
        s2 = (*paPVar1)[uVar4].inputs[uVar5];
        if (s2 == (ctmbstr)0x0) break;
        iVar3 = prvTidytmbstrcasecmp(work,s2);
        uVar5 = (ulong)((int)uVar5 + 1);
        if (iVar3 == 0) {
          *result = uVar4;
          return yes;
        }
      }
      uVar4 = uVar4 + 1;
    }
  }
  prvTidyReportBadArgument(doc,entry->name);
  return no;
}

Assistant:

static Bool GetParsePickListValue( TidyDocImpl* doc, const TidyOptionImpl* entry, uint *result )
{
    TidyConfigImpl* cfg = &doc->config;
    tchar c = SkipWhite( cfg );
    tmbchar work[ 16 ] = {0};
    tmbstr cp = work, end = work + sizeof(work);

    while ( c!=EndOfStream && cp < end && !TY_(IsWhite)(c) && c != '\r' && c != '\n' )
    {
        *cp++ = (tmbchar) c;
        c = AdvanceChar( cfg );
    }

    if ( GetPickListValue( work, entry->pickList, result ) != yes )
    {
        TY_(ReportBadArgument)( doc, entry->name );
        return no;
    }

    return yes;
}